

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O0

bool findInBlock(QTextBlock *block,QString *expression,int offset,FindFlags options,
                QTextCursor *cursor)

{
  bool bVar1;
  Int IVar2;
  int iVar3;
  qsizetype qVar4;
  QTextDocumentPrivate *this;
  long lVar5;
  CaseSensitivity in_EDX;
  QString *in_RSI;
  QTextBlock *in_RDI;
  long in_FS_OFFSET;
  int end;
  int start;
  int idx;
  CaseSensitivity sensitivity;
  QString text;
  undefined4 in_stack_ffffffffffffff28;
  FindFlag in_stack_ffffffffffffff2c;
  QFlags<QTextDocument::FindFlag> *in_stack_ffffffffffffff30;
  QTextDocumentPrivate *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff48;
  CaseSensitivity in_stack_ffffffffffffff4c;
  undefined6 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  bool bVar6;
  int local_98;
  CaseSensitivity local_64;
  bool local_49;
  QFlagsStorageHelper<QTextDocument::FindFlag,_4> local_40;
  char16_t local_3c;
  char16_t local_3a;
  QFlagsStorageHelper<QTextDocument::FindFlag,_4> local_38;
  QFlagsStorageHelper<QTextDocument::FindFlag,_4> local_34;
  QFlagsStorageHelper<QTextDocument::FindFlag,_4> local_30;
  QChar local_2c;
  QChar local_2a;
  QString local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::text((QTextBlock *)
                   CONCAT17(in_stack_ffffffffffffff5f,
                            CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)));
  QChar::QChar<QChar::SpecialCharacter,_true>(&local_2a,Nbsp);
  QChar::QChar<char16_t,_true>(&local_2c,L' ');
  QString::replace((QChar)(char16_t)&local_28,local_2a,(uint)(ushort)local_2c.ucs);
  local_30.super_QFlagsStorage<QTextDocument::FindFlag>.i =
       (QFlagsStorage<QTextDocument::FindFlag>)
       QFlags<QTextDocument::FindFlag>::operator&
                 (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  QFlags::operator_cast_to_unsigned_int((QFlags *)&local_30);
  local_64 = in_EDX;
  while( true ) {
    bVar1 = false;
    if (-1 < (int)local_64) {
      qVar4 = QString::size(&local_28);
      bVar1 = (int)local_64 <= qVar4;
    }
    if (!bVar1) {
      local_49 = false;
      goto LAB_007acfda;
    }
    local_34.super_QFlagsStorage<QTextDocument::FindFlag>.i =
         (QFlagsStorage<QTextDocument::FindFlag>)
         QFlags<QTextDocument::FindFlag>::operator&
                   (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_34);
    if (IVar2 == 0) {
      local_98 = QString::indexOf((QString *)&local_28,(longlong)in_RSI,local_64);
    }
    else {
      local_98 = QString::lastIndexOf((QString *)&local_28,(longlong)in_RSI,local_64);
    }
    if (local_98 == -1) {
      local_49 = false;
      goto LAB_007acfda;
    }
    local_38.super_QFlagsStorage<QTextDocument::FindFlag>.i =
         (QFlagsStorage<QTextDocument::FindFlag>)
         QFlags<QTextDocument::FindFlag>::operator&
                   (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_38);
    if (IVar2 == 0) break;
    qVar4 = QString::size(in_RSI);
    iVar3 = local_98 + (int)qVar4;
    if (local_98 == 0) {
LAB_007ace60:
      qVar4 = QString::size(&local_28);
      bVar6 = false;
      if (iVar3 != qVar4) {
        local_3c = (char16_t)
                   QString::at((QString *)in_stack_ffffffffffffff38,
                               (qsizetype)in_stack_ffffffffffffff30);
        bVar6 = QChar::isLetterOrNumber((QChar *)0x7aceb1);
      }
    }
    else {
      local_3a = (char16_t)
                 QString::at((QString *)in_stack_ffffffffffffff38,
                             (qsizetype)in_stack_ffffffffffffff30);
      bVar1 = QChar::isLetterOrNumber((QChar *)0x7ace53);
      bVar6 = true;
      if (!bVar1) goto LAB_007ace60;
    }
    if (bVar6 == false) break;
    local_40.super_QFlagsStorage<QTextDocument::FindFlag>.i =
         (QFlagsStorage<QTextDocument::FindFlag>)
         QFlags<QTextDocument::FindFlag>::operator&
                   (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_40);
    if (IVar2 == 0) {
      in_stack_ffffffffffffff4c = iVar3 + CaseSensitive;
      local_64 = in_stack_ffffffffffffff4c;
    }
    else {
      in_stack_ffffffffffffff4c = local_98 - CaseSensitive;
      local_64 = in_stack_ffffffffffffff4c;
    }
  }
  this = QTextDocumentPrivate::get(in_RDI);
  QTextBlock::position((QTextBlock *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  QTextCursorPrivate::fromPosition(in_stack_ffffffffffffff38,(int)((ulong)this >> 0x20));
  QTextCursor::operator=
            ((QTextCursor *)this,
             (QTextCursor *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  QTextCursor::~QTextCursor((QTextCursor *)0x7acf77);
  iVar3 = QTextCursor::position
                    ((QTextCursor *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  lVar5 = (long)iVar3;
  QString::size(in_RSI);
  QTextCursor::setPosition
            ((QTextCursor *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             (int)((ulong)lVar5 >> 0x20),(MoveMode)lVar5);
  local_49 = true;
LAB_007acfda:
  QString::~QString((QString *)0x7acfe7);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_49;
}

Assistant:

static bool findInBlock(const QTextBlock &block, const QString &expression, int offset,
                        QTextDocument::FindFlags options, QTextCursor *cursor)
{
    QString text = block.text();
    text.replace(QChar::Nbsp, u' ');
    Qt::CaseSensitivity sensitivity = options & QTextDocument::FindCaseSensitively ? Qt::CaseSensitive : Qt::CaseInsensitive;
    int idx = -1;

    while (offset >= 0 && offset <= text.size()) {
        idx = (options & QTextDocument::FindBackward) ?
               text.lastIndexOf(expression, offset, sensitivity) : text.indexOf(expression, offset, sensitivity);
        if (idx == -1)
            return false;

        if (options & QTextDocument::FindWholeWords) {
            const int start = idx;
            const int end = start + expression.size();
            if ((start != 0 && text.at(start - 1).isLetterOrNumber())
                || (end != text.size() && text.at(end).isLetterOrNumber())) {
                //if this is not a whole word, continue the search in the string
                offset = (options & QTextDocument::FindBackward) ? idx-1 : end+1;
                idx = -1;
                continue;
            }
        }
        //we have a hit, return the cursor for that.
        *cursor = QTextCursorPrivate::fromPosition(const_cast<QTextDocumentPrivate *>(QTextDocumentPrivate::get(block)),
                                                   block.position() + idx);
        cursor->setPosition(cursor->position() + expression.size(), QTextCursor::KeepAnchor);
        return true;
    }
    return false;
}